

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O2

bool __thiscall
csm::ModelIdentifier::addComponent(ModelIdentifier *this,string *argName,double argValue)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>,_bool>
  pVar1;
  MIComponent component;
  Data local_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  local_40;
  
  local_58.theType = DOUBLE_TYPE;
  local_58.field_1.theDbl = argValue;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>(&local_40,argName,&local_58);
  MIC::Data::~Data(&local_58);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,csm::MIC::Data>const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
                      *)this,&local_40);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::~pair(&local_40);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool ModelIdentifier::addComponent(const std::string& argName,
                                   double             argValue)
{
   MIComponent component(argName,MIC::Data(argValue));
   
   return addComponent(component);
}